

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImGuiTableCellData *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  ImGuiWindow *pIVar6;
  ImDrawList *pIVar7;
  ImGuiTableCellData *pIVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  ImGuiTableColumn *p_1;
  ImGuiTableColumn *pIVar12;
  char *__function;
  long lVar13;
  int iVar14;
  int iVar15;
  ImGuiTableCellData *p;
  ImGuiTableCellData *pIVar16;
  int iVar17;
  ImU32 col;
  ImU32 col_00;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  ImRect IVar22;
  ImRect row_rect;
  ImVec2 local_70;
  ImVec2 IStack_68;
  int local_5c;
  float local_58;
  ImU32 local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar6 = GImGui->CurrentWindow;
  if (pIVar6 != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x645,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x646,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  fVar3 = table->RowPosY2;
  (pIVar6->DC).CursorPos.y = fVar3;
  fVar21 = table->RowPosY1;
  if (table->CurrentRow == 0) {
    table->LastFirstRowHeight = fVar3 - fVar21;
  }
  iVar14 = table->CurrentRow + 1;
  iVar15 = (int)table->FreezeRowsCount;
  iVar17 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar3) && (fVar21 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_48 = ZEXT416((uint)fVar21);
    local_58 = fVar3;
    local_50 = iVar17;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      fVar21 = (float)local_48._0_4_;
    }
    col = table->RowBgColor[1];
    local_54 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       (local_54 = 0, (table->Flags & 0x80) != 0)) {
      local_54 = table->RowBgColor[(ulong)((table->field_0x92 & 1) == 0) + 2];
    }
    cVar5 = table->RowCellDataCurrent;
    local_4c = iVar14;
    if ((-1 < cVar5 || iVar14 == iVar15) || (local_54 != 0 || (col != 0 || col_00 != 0))) {
      local_5c = CONCAT31(local_5c._1_3_,cVar5);
      if ((table->Flags & 0x80000) == 0) {
        pIVar7 = pIVar6->DrawList;
        fVar3 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar21 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar4 = (table->Bg0ClipRectForDrawCmd).Max.y;
        (pIVar7->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar7->_CmdHeader).ClipRect.y = fVar3;
        (pIVar7->_CmdHeader).ClipRect.z = fVar21;
        (pIVar7->_CmdHeader).ClipRect.w = fVar4;
      }
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar6->DrawList,0);
      fVar21 = (float)local_48._0_4_;
      cVar5 = (char)local_5c;
    }
    local_5c = iVar15;
    if (col != 0 || col_00 != 0) {
      fVar3 = (table->WorkRect).Min.x;
      IStack_68.x = (table->WorkRect).Max.x;
      fVar4 = (table->BgClipRect).Min.x;
      fVar20 = (table->BgClipRect).Min.y;
      uVar18 = -(uint)(fVar4 <= fVar3);
      uVar19 = -(uint)(fVar20 <= fVar21);
      local_70.y = (float)(~uVar19 & (uint)fVar20 | uVar19 & (uint)fVar21);
      local_70.x = (float)(~uVar18 & (uint)fVar4 | (uint)fVar3 & uVar18);
      fVar3 = (table->BgClipRect).Max.x;
      if (fVar3 <= IStack_68.x) {
        IStack_68.x = fVar3;
      }
      fVar3 = (table->BgClipRect).Max.y;
      IStack_68.y = local_58;
      if (fVar3 <= local_58) {
        IStack_68.y = fVar3;
      }
      if ((col_00 != 0) && (local_70.y < IStack_68.y)) {
        ImDrawList::AddRectFilled(pIVar6->DrawList,&local_70,&IStack_68,col_00,0.0,0xf);
      }
      if ((col != 0) && (local_70.y < IStack_68.y)) {
        ImDrawList::AddRectFilled(pIVar6->DrawList,&local_70,&IStack_68,col,0.0,0xf);
      }
    }
    if (-1 < cVar5) {
      if (-1 < (long)table->RowCellDataCurrent) {
        pIVar16 = (table->RowCellData).Data;
        pIVar8 = (table->RowCellData).DataEnd;
        pIVar1 = pIVar16 + table->RowCellDataCurrent;
        if ((pIVar1 < pIVar8) && (pIVar16 < pIVar8)) {
          do {
            if (((long)pIVar16->Column < 0) ||
               (pIVar12 = (table->Columns).Data + pIVar16->Column,
               (table->Columns).DataEnd <= pIVar12)) goto LAB_00191e43;
            IVar22 = TableGetCellBgRect(table,(int)pIVar16->Column);
            local_70.x = IVar22.Min.x;
            local_70.y = IVar22.Min.y;
            fVar3 = (table->BgClipRect).Min.x;
            fVar21 = (table->BgClipRect).Min.y;
            uVar18 = -(uint)(fVar3 <= local_70.x);
            local_70.x = (float)(~uVar18 & (uint)fVar3 | (uint)local_70.x & uVar18);
            uVar18 = -(uint)(fVar21 <= local_70.y);
            local_70.y = (float)(~uVar18 & (uint)fVar21 | (uint)local_70.y & uVar18);
            IStack_68.x = IVar22.Max.x;
            fVar3 = (table->BgClipRect).Max.x;
            fVar21 = IStack_68.x;
            if (fVar3 <= IStack_68.x) {
              fVar21 = fVar3;
            }
            IStack_68.y = IVar22.Max.y;
            fVar3 = (table->BgClipRect).Max.y;
            fVar4 = IStack_68.y;
            if (fVar3 <= IStack_68.y) {
              fVar4 = fVar3;
            }
            IStack_68.y = fVar4;
            IStack_68.x = fVar21;
            fVar3 = (pIVar12->ClipRect).Min.x;
            uVar18 = -(uint)(fVar3 <= local_70.x);
            local_70.x = (float)(~uVar18 & (uint)fVar3 | (uint)local_70.x & uVar18);
            if (pIVar12->MaxX <= fVar21) {
              fVar21 = pIVar12->MaxX;
            }
            IStack_68.x = fVar21;
            ImDrawList::AddRectFilled
                      (pIVar6->DrawList,&local_70,&IStack_68,pIVar16->BgColor,0.0,0xf);
            pIVar16 = pIVar16 + 1;
          } while (pIVar16 <= pIVar1);
          goto LAB_00191bb9;
        }
      }
      __function = "T &ImSpan<ImGuiTableCellData>::operator[](int) [T = ImGuiTableCellData]";
      goto LAB_00191e58;
    }
LAB_00191bb9:
    if (((local_54 != 0) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_70.y = (float)local_48._0_4_;
      local_70.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar6->DrawList,&local_70,&local_38,local_54,1.0);
    }
    iVar14 = local_4c;
    iVar17 = local_50;
    iVar15 = local_5c;
    if (((local_4c == local_5c) && ((table->BgClipRect).Min.y <= local_58)) &&
       (local_58 < (table->BgClipRect).Max.y)) {
      local_70.y = local_58;
      local_70.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = local_58;
      ImDrawList::AddLine(pIVar6->DrawList,&local_70,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar14 == iVar17) && (iVar17 = table->ColumnsCount, 0 < (long)iVar17)) {
    pIVar12 = (table->Columns).Data;
    lVar13 = 0;
    do {
      if ((table->Columns).DataEnd <= pIVar12) goto LAB_00191e43;
      pIVar12->NavLayerCurrent = lVar13 < table->FreezeColumnsCount;
      lVar13 = lVar13 + 1;
      pIVar12 = pIVar12 + 1;
    } while (iVar17 != lVar13);
  }
  if (iVar14 == iVar15) {
    if (table->IsUnfrozenRows != false) {
      __assert_fail("table->IsUnfrozenRows == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0x6a5,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    table->IsUnfrozenRows = true;
    fVar3 = table->RowPosY2;
    fVar21 = (pIVar6->InnerClipRect).Min.y;
    fVar4 = (pIVar6->InnerClipRect).Max.y;
    uVar18 = -(uint)(fVar21 <= fVar3 + 1.0);
    fVar21 = (float)(~uVar18 & (uint)fVar21 | (uint)(fVar3 + 1.0) & uVar18);
    if (fVar4 <= fVar21) {
      fVar21 = fVar4;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar21;
    (table->BgClipRect).Min.y = fVar21;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar4;
    (table->BgClipRect).Max.y = fVar4;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    if (fVar4 < fVar21) {
      __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0x6ad,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    fVar4 = table->RowPosY1;
    fVar20 = (fVar3 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar6->DC).CursorPos.y = fVar20;
    table->RowPosY2 = fVar20;
    table->RowPosY1 = fVar20 - (fVar3 - fVar4);
    lVar13 = (long)table->ColumnsCount;
    if (0 < lVar13) {
      pIVar12 = (table->Columns).Data;
      do {
        if ((table->Columns).DataEnd <= pIVar12) goto LAB_00191e43;
        pIVar12->DrawChannelCurrent = pIVar12->DrawChannelUnfrozen;
        (pIVar12->ClipRect).Min.y = fVar21;
        pIVar12 = pIVar12 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pIVar12 = (table->Columns).Data;
    if (pIVar12 < (table->Columns).DataEnd) {
      IVar10 = (pIVar12->ClipRect).Min;
      IVar11 = (pIVar12->ClipRect).Max;
      IVar9 = (pIVar12->ClipRect).Max;
      (pIVar6->ClipRect).Min = (pIVar12->ClipRect).Min;
      (pIVar6->ClipRect).Max = IVar9;
      pIVar7 = pIVar6->DrawList;
      (pIVar7->_CmdHeader).ClipRect.x = IVar10.x;
      (pIVar7->_CmdHeader).ClipRect.y = IVar10.y;
      (pIVar7->_CmdHeader).ClipRect.z = IVar11.x;
      (pIVar7->_CmdHeader).ClipRect.w = IVar11.y;
      pIVar2 = (pIVar6->DrawList->_ClipRectStack).Data +
               (long)(pIVar6->DrawList->_ClipRectStack).Size + -1;
      pIVar2->x = IVar10.x;
      pIVar2->y = IVar10.y;
      pIVar2->z = IVar11.x;
      pIVar2->w = IVar11.y;
      pIVar12 = (table->Columns).Data;
      if (pIVar12 < (table->Columns).DataEnd) {
        ImDrawListSplitter::SetCurrentChannel
                  (&table->DrawSplitter,pIVar6->DrawList,(uint)pIVar12->DrawChannelCurrent);
        goto LAB_00191e1e;
      }
    }
LAB_00191e43:
    __function = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00191e58:
    __assert_fail("p >= Data && p < DataEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                  ,0x20c,__function);
  }
LAB_00191e1e:
  if ((table->field_0x90 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}